

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<double,int>,double,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (double *adata,AggregateInputData *aggr_input_data,int *bdata,
               ArgMinMaxState<double,_int> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  bool bVar1;
  AggregateBinaryInput *binary;
  AggregateInputData *in_RSI;
  int *in_R8;
  SelectionVector *in_R9;
  idx_t sidx_1;
  idx_t i_1;
  idx_t sidx;
  idx_t i;
  AggregateBinaryInput input;
  idx_t in_stack_ffffffffffffff90;
  int *piVar2;
  AggregateBinaryInput *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  AggregateInputData *in_stack_ffffffffffffffa8;
  ArgMinMaxState<double,_int> *in_stack_ffffffffffffffb0;
  
  AggregateBinaryInput::AggregateBinaryInput
            ((AggregateBinaryInput *)&stack0xffffffffffffffa8,in_RSI,(ValidityMask *)i,
             (ValidityMask *)input.input);
  bVar1 = ArgMinMaxBase<duckdb::GreaterThan,_true>::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)i), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1)))) {
    for (piVar2 = (int *)0x0; piVar2 < in_R8; piVar2 = (int *)((long)piVar2 + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)piVar2);
      SelectionVector::get_index((SelectionVector *)i_1,(idx_t)piVar2);
      SelectionVector::get_index((SelectionVector *)sidx,(idx_t)piVar2);
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Operation<double,int,duckdb::ArgMinMaxState<double,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                (in_stack_ffffffffffffffb0,(double *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    for (piVar2 = (int *)0x0; piVar2 < in_R8; piVar2 = (int *)((long)piVar2 + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)piVar2);
      SelectionVector::get_index((SelectionVector *)i_1,(idx_t)piVar2);
      binary = (AggregateBinaryInput *)
               SelectionVector::get_index((SelectionVector *)sidx,(idx_t)piVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)binary,in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)binary,
                             in_stack_ffffffffffffff90), bVar1)) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<double,int,duckdb::ArgMinMaxState<double,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  (in_stack_ffffffffffffffb0,(double *)in_stack_ffffffffffffffa8,piVar2,binary);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}